

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O2

void Abc_NtkCollectOverlapCands(Abc_Obj_t *pLut,Vec_Ptr_t *vCands,Nwk_LMPars_t *pPars)

{
  uint *puVar1;
  long *plVar2;
  Abc_Obj_t *p;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  for (lVar5 = 0; lVar5 < (pLut->vFanins).nSize; lVar5 = lVar5 + 1) {
    puVar1 = (uint *)((long)pLut->pNtk->vObjs->pArray[(pLut->vFanins).pArray[lVar5]] + 0x14);
    *puVar1 = *puVar1 | 0x40;
  }
  vCands->nSize = 0;
  Abc_NtkIncrementTravId(pLut->pNtk);
  Abc_NodeSetTravIdCurrent(pLut);
  for (lVar5 = 0; uVar7 = (ulong)(pLut->vFanins).nSize, lVar5 < (long)uVar7; lVar5 = lVar5 + 1) {
    plVar2 = (long *)pLut->pNtk->vObjs->pArray[(pLut->vFanins).pArray[lVar5]];
    if (((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7) &&
       (iVar3 = *(int *)((long)plVar2 + 0x2c), iVar3 <= pPars->nMaxFanout)) {
      for (lVar8 = 0; lVar8 < iVar3; lVar8 = lVar8 + 1) {
        p = *(Abc_Obj_t **)
             (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)(plVar2[6] + lVar8 * 4) * 8);
        if ((*(uint *)&p->field_0x14 & 0xf) == 7) {
          iVar3 = Abc_NodeIsTravIdCurrent(p);
          if (iVar3 == 0) {
            Abc_NodeSetTravIdCurrent(p);
            uVar4 = *(uint *)&pLut->field_0x14 >> 0xc;
            uVar6 = *(uint *)&p->field_0x14 >> 0xc;
            if ((int)(uVar6 - uVar4) <= pPars->nMaxLevelDiff &&
                (int)(uVar4 - uVar6) <= pPars->nMaxLevelDiff) {
              iVar3 = Abc_NtkCountTotalFanins(pLut,p);
              if (iVar3 <= pPars->nMaxSuppSize) {
                Vec_PtrPush(vCands,p);
              }
            }
          }
        }
        iVar3 = *(int *)((long)plVar2 + 0x2c);
      }
    }
  }
  for (lVar5 = 0; lVar5 < (int)uVar7; lVar5 = lVar5 + 1) {
    puVar1 = (uint *)((long)pLut->pNtk->vObjs->pArray[(pLut->vFanins).pArray[lVar5]] + 0x14);
    *puVar1 = *puVar1 & 0xffffffbf;
    uVar7 = (ulong)(uint)(pLut->vFanins).nSize;
  }
  return;
}

Assistant:

void Abc_NtkCollectOverlapCands( Abc_Obj_t * pLut, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Abc_Obj_t * pFanin, * pObj;
    int i, k;
    // mark fanins of pLut
    Abc_ObjForEachFanin( pLut, pFanin, i )
        pFanin->fMarkC = 1;
    // collect the matching fanouts of each fanin of the node
    Vec_PtrClear( vCands );
    Abc_NtkIncrementTravId( pLut->pNtk );
    Abc_NodeSetTravIdCurrent( pLut );
    Abc_ObjForEachFanin( pLut, pFanin, i )
    {
        if ( !Abc_ObjIsNode(pFanin) )
            continue;
        if ( Abc_ObjFanoutNum(pFanin) > pPars->nMaxFanout )
            continue;
        Abc_ObjForEachFanout( pFanin, pObj, k )
        {
            if ( !Abc_ObjIsNode(pObj) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pObj ) )
                continue;
            Abc_NodeSetTravIdCurrent( pObj );
            // check the difference in delay
            if ( Abc_ObjLevel(pLut) - Abc_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
                 Abc_ObjLevel(pObj) - Abc_ObjLevel(pLut) > pPars->nMaxLevelDiff )
                 continue;
            // check the total number of fanins of the node
            if ( Abc_NtkCountTotalFanins(pLut, pObj) > pPars->nMaxSuppSize )
                continue;
            Vec_PtrPush( vCands, pObj );
        }
    }
    // unmark fanins of pLut
    Abc_ObjForEachFanin( pLut, pFanin, i )
        pFanin->fMarkC = 0;
}